

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O3

int tidySaveFile(TidyDoc tdoc,ctmbstr filnam)

{
  int iVar1;
  FILE *__stream;
  StreamOut *out;
  
  if (((tdoc[0xcdf]._opaque == 0) || (tdoc[0x3a]._opaque == 0)) || (tdoc[0xa6]._opaque != 0)) {
    __stream = fopen(filnam,"wb");
    if (__stream == (FILE *)0x0) {
      prvTidyFileError((TidyDocImpl *)tdoc,filnam,TidyError);
      iVar1 = -2;
    }
    else {
      out = prvTidyFileOutput((TidyDocImpl *)tdoc,(FILE *)__stream,tdoc[0x28]._opaque,
                              tdoc[0x2a]._opaque);
      iVar1 = tidyDocSaveStream((TidyDocImpl *)tdoc,out);
      fclose(__stream);
      (**(code **)(**(long **)(tdoc + 0xcea) + 0x10))(*(long **)(tdoc + 0xcea),out);
      if (*(long *)(tdoc + 0xcf0) != 0) {
        utime(filnam,(utimbuf *)(tdoc + 0xcf0));
        ((utimbuf *)(tdoc + 0xcf0))->actime = 0;
        *(undefined8 *)(tdoc + 0xcf2) = 0;
      }
    }
  }
  else {
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int TIDY_CALL        tidySaveFile( TidyDoc tdoc, ctmbstr filnam )
{
    TidyDocImpl* doc = tidyDocToImpl( tdoc );
    return tidyDocSaveFile( doc, filnam );
}